

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lexer.cpp
# Opt level: O0

int jsonnet::internal::whitespace_check(char *a,char *b)

{
  bool bVar1;
  int i;
  char *b_local;
  char *a_local;
  
  i = 0;
  while( true ) {
    bVar1 = true;
    if (a[i] != ' ') {
      bVar1 = a[i] == '\t';
    }
    if (!bVar1) break;
    if (b[i] != a[i]) {
      return 0;
    }
    i = i + 1;
  }
  return i;
}

Assistant:

static int whitespace_check(const char *a, const char *b)
{
    int i = 0;
    while (a[i] == ' ' || a[i] == '\t') {
        if (b[i] != a[i])
            return 0;
        i++;
    }
    return i;
}